

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

bool_t derIsValid2(octet *der,size_t count,u32 tag)

{
  bool_t bVar1;
  u32 in_EDX;
  size_t in_RSI;
  octet *in_RDI;
  size_t len;
  u32 t;
  size_t l_count;
  size_t t_count;
  bool local_41;
  size_t local_40;
  u32 local_34;
  size_t local_30;
  size_t local_28;
  u32 local_1c;
  size_t local_18;
  octet *local_10;
  uint local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = derTDec(&local_34,in_RDI,in_RSI);
  if ((local_28 == 0xffffffffffffffff) || (local_34 != local_1c)) {
    local_4 = 0;
  }
  else {
    local_30 = derLDec(&local_40,local_10 + local_28,local_18 - local_28);
    if (local_30 == 0xffffffffffffffff) {
      local_4 = 0;
    }
    else {
      local_41 = false;
      if (local_18 == local_28 + local_30 + local_40) {
        bVar1 = memIsValid(local_10 + local_30 + local_28,local_40);
        local_41 = bVar1 != 0;
      }
      local_4 = (uint)local_41;
    }
  }
  return local_4;
}

Assistant:

bool_t derIsValid2(const octet der[], size_t count, u32 tag)
{
	size_t t_count;
	size_t l_count;
	u32 t;
	size_t len;
	// обработать T
	t_count = derTDec(&t, der, count);
	if (t_count == SIZE_MAX || t != tag)
		return FALSE;
	// обработать L
	l_count = derLDec(&len, der + t_count, count - t_count);
	if (l_count == SIZE_MAX)
		return FALSE;
	// проверить V
	return count == t_count + l_count + len &&
		memIsValid(der + t_count + l_count, len);
}